

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O2

bool __thiscall
node::anon_unknown_2::MinerImpl::testBlockValidity
          (MinerImpl *this,CBlock *block,bool check_merkle_root,BlockValidationState *state)

{
  pointer ppCVar1;
  CChainParams *chainparams;
  bool bVar2;
  ChainstateManager *pCVar3;
  Chainstate *pCVar4;
  CBlockIndex *this_00;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock45;
  allocator<char> local_69;
  unique_lock<std::recursive_mutex> local_68;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&local_68,&cs_main,"cs_main",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/interfaces.cpp"
             ,0x3cc,false);
  pCVar3 = chainman(this);
  pCVar4 = ChainstateManager::ActiveChainstate(pCVar3);
  ppCVar1 = (pCVar4->m_chain).vChain.
            super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppCVar1 ==
      (pCVar4->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    this_00 = (CBlockIndex *)0x0;
  }
  else {
    this_00 = ppCVar1[-1];
  }
  CBlockIndex::GetBlockHash((uint256 *)&local_58,this_00);
  bVar2 = operator!=(&(block->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>,
                     (base_blob<256U> *)&local_58);
  if (bVar2) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"Block does not connect to current chain tip.",&local_69);
    ValidationState<BlockValidationResult>::Error
              (&state->super_ValidationState<BlockValidationResult>,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    bVar2 = false;
  }
  else {
    pCVar3 = chainman(this);
    chainparams = (pCVar3->m_options).chainparams;
    pCVar3 = chainman(this);
    pCVar4 = ChainstateManager::ActiveChainstate(pCVar3);
    bVar2 = TestBlockValidity(state,chainparams,pCVar4,block,this_00,false,check_merkle_root);
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool testBlockValidity(const CBlock& block, bool check_merkle_root, BlockValidationState& state) override
    {
        LOCK(cs_main);
        CBlockIndex* tip{chainman().ActiveChain().Tip()};
        // Fail if the tip updated before the lock was taken
        if (block.hashPrevBlock != tip->GetBlockHash()) {
            state.Error("Block does not connect to current chain tip.");
            return false;
        }

        return TestBlockValidity(state, chainman().GetParams(), chainman().ActiveChainstate(), block, tip, /*fCheckPOW=*/false, check_merkle_root);
    }